

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ImplicationConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicationConstraintSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ConstraintItemSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,ConstraintItemSyntax *args_2)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  ImplicationConstraintSyntax *pIVar6;
  
  pIVar6 = (ImplicationConstraintSyntax *)allocate(this,0x38,8);
  TVar2 = args_1->kind;
  uVar3 = args_1->field_0x2;
  NVar4.raw = (args_1->numFlags).raw;
  uVar5 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pIVar6->super_ConstraintItemSyntax).super_SyntaxNode.kind = ImplicationConstraint;
  (pIVar6->super_ConstraintItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pIVar6->super_ConstraintItemSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pIVar6->left).ptr = args;
  (pIVar6->arrow).kind = TVar2;
  (pIVar6->arrow).field_0x2 = uVar3;
  (pIVar6->arrow).numFlags = (NumericTokenFlags)NVar4.raw;
  (pIVar6->arrow).rawLen = uVar5;
  (pIVar6->arrow).info = pIVar1;
  (pIVar6->constraints).ptr = args_2;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pIVar6;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pIVar6;
  return pIVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }